

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::SymbolicallyPerturbedSign
              (Vector3_xf *a,Vector3_xf *b,Vector3_xf *c,Vector3_xf *b_cross_c)

{
  bool bVar1;
  uint uVar2;
  int32 iVar3;
  int iVar4;
  int b_00;
  ExactFloat local_b0;
  BasicVector<Vector3,_ExactFloat,_3UL> local_a0 [8];
  BigNum local_98;
  ExactFloat local_90;
  ExactFloat local_80;
  BasicVector<Vector3,_ExactFloat,_3UL> local_70 [8];
  BigNum local_68;
  ExactFloat local_60;
  ExactFloat local_50;
  S2LogMessage local_40;
  
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator<
                    ((BasicVector<Vector3,_ExactFloat,_3UL> *)a,b);
  if ((!bVar1) ||
     (bVar1 = util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator<
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)b,c), !bVar1)) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x8c,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_b0.bn_.bn_,"Check failed: a < b && b < c ");
LAB_0024f40a:
    abort();
  }
  iVar4 = (int)b_cross_c;
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,iVar4);
  iVar3 = local_b0.sign_;
  uVar2 = local_b0.bn_exp_ & 0xfffffffd;
  ExactFloat::BigNum::~BigNum(&local_b0.bn_);
  if (iVar3 == 0 || uVar2 == 0x7ffffffd) {
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,iVar4);
    iVar3 = local_b0.sign_;
    uVar2 = local_b0.bn_exp_ & 0xfffffffd;
    ExactFloat::BigNum::~BigNum(&local_b0.bn_);
    if (iVar3 == 0 || uVar2 == 0x7ffffffd) {
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,iVar4);
      iVar3 = local_b0.sign_;
      uVar2 = local_b0.bn_exp_ & 0xfffffffd;
      ExactFloat::BigNum::~BigNum(&local_b0.bn_);
      if (iVar3 == 0 || uVar2 == 0x7ffffffd) {
        iVar4 = (int)c;
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_60,iVar4);
        b_00 = (int)a;
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  (local_70,b_00);
        operator*(&local_50,&local_60);
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_90,iVar4);
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  (local_a0,b_00);
        operator*(&local_80,&local_90);
        operator-(&local_b0,&local_50);
        iVar3 = local_b0.sign_;
        uVar2 = local_b0.bn_exp_ & 0xfffffffd;
        ExactFloat::BigNum::~BigNum(&local_b0.bn_);
        ExactFloat::BigNum::~BigNum(&local_80.bn_);
        ExactFloat::BigNum::~BigNum(&local_98);
        ExactFloat::BigNum::~BigNum(&local_90.bn_);
        ExactFloat::BigNum::~BigNum(&local_50.bn_);
        ExactFloat::BigNum::~BigNum(&local_68);
        ExactFloat::BigNum::~BigNum(&local_60.bn_);
        if (iVar3 == 0 || uVar2 == 0x7ffffffd) {
          util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                    ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,iVar4);
          iVar3 = local_b0.sign_;
          uVar2 = local_b0.bn_exp_ & 0xfffffffd;
          ExactFloat::BigNum::~BigNum(&local_b0.bn_);
          if (iVar3 == 0 || uVar2 == 0x7ffffffd) {
            util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                      ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,iVar4);
            iVar3 = local_b0.sign_;
            uVar2 = local_b0.bn_exp_ & 0xfffffffd;
            ExactFloat::BigNum::~BigNum(&local_b0.bn_);
            if (iVar3 == 0 || uVar2 == 0x7ffffffd) {
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_60,iVar4);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        (local_70,b_00);
              operator*(&local_50,&local_60);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_90,iVar4);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        (local_a0,b_00);
              operator*(&local_80,&local_90);
              operator-(&local_b0,&local_50);
              iVar3 = local_b0.sign_;
              uVar2 = local_b0.bn_exp_ & 0xfffffffd;
              ExactFloat::BigNum::~BigNum(&local_b0.bn_);
              ExactFloat::BigNum::~BigNum(&local_80.bn_);
              ExactFloat::BigNum::~BigNum(&local_98);
              ExactFloat::BigNum::~BigNum(&local_90.bn_);
              ExactFloat::BigNum::~BigNum(&local_50.bn_);
              ExactFloat::BigNum::~BigNum(&local_68);
              ExactFloat::BigNum::~BigNum(&local_60.bn_);
              if (iVar3 != 0 && uVar2 != 0x7ffffffd) {
                return iVar3;
              }
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,iVar4);
              iVar3 = local_b0.sign_;
              uVar2 = local_b0.bn_exp_ & 0xfffffffd;
              ExactFloat::BigNum::~BigNum(&local_b0.bn_);
              if (iVar3 != 0 && uVar2 != 0x7ffffffd) {
                return iVar3;
              }
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_60,iVar4);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        (local_70,b_00);
              operator*(&local_50,&local_60);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_90,iVar4);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        (local_a0,b_00);
              operator*(&local_80,&local_90);
              operator-(&local_b0,&local_50);
              if (((local_b0.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) && (local_b0.sign_ != 0)) {
                S2LogMessage::S2LogMessage
                          (&local_40,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                           ,0xd0,kFatal,(ostream *)&std::cerr);
                std::operator<<(local_40.stream_,
                                "Check failed: (0) == ((c[1]*a[2] - c[2]*a[1]).sgn()) ");
                goto LAB_0024f40a;
              }
              ExactFloat::BigNum::~BigNum(&local_b0.bn_);
              ExactFloat::BigNum::~BigNum(&local_80.bn_);
              ExactFloat::BigNum::~BigNum(&local_98);
              ExactFloat::BigNum::~BigNum(&local_90.bn_);
              ExactFloat::BigNum::~BigNum(&local_50.bn_);
              ExactFloat::BigNum::~BigNum(&local_68);
              ExactFloat::BigNum::~BigNum(&local_60.bn_);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_60,b_00);
              iVar4 = (int)b;
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        (local_70,iVar4);
              operator*(&local_50,&local_60);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_90,b_00);
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        (local_a0,iVar4);
              operator*(&local_80,&local_90);
              operator-(&local_b0,&local_50);
              iVar3 = local_b0.sign_;
              uVar2 = local_b0.bn_exp_ & 0xfffffffd;
              ExactFloat::BigNum::~BigNum(&local_b0.bn_);
              ExactFloat::BigNum::~BigNum(&local_80.bn_);
              ExactFloat::BigNum::~BigNum(&local_98);
              ExactFloat::BigNum::~BigNum(&local_90.bn_);
              ExactFloat::BigNum::~BigNum(&local_50.bn_);
              ExactFloat::BigNum::~BigNum(&local_68);
              ExactFloat::BigNum::~BigNum(&local_60.bn_);
              if (iVar3 != 0 && uVar2 != 0x7ffffffd) {
                return iVar3;
              }
              util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                        ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,iVar4);
              iVar3 = local_b0.sign_;
              uVar2 = local_b0.bn_exp_ & 0xfffffffd;
              ExactFloat::BigNum::~BigNum(&local_b0.bn_);
              if (iVar3 == 0 || uVar2 == 0x7ffffffd) {
                util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                          ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,iVar4);
                iVar3 = local_b0.sign_;
                uVar2 = local_b0.bn_exp_ & 0xfffffffd;
                ExactFloat::BigNum::~BigNum(&local_b0.bn_);
                if (iVar3 != 0 && uVar2 != 0x7ffffffd) {
                  return iVar3;
                }
                util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                          ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,b_00);
                ExactFloat::BigNum::~BigNum(&local_b0.bn_);
                if ((local_b0.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
                  return local_b0.sign_ + (uint)(local_b0.sign_ == 0);
                }
                return 1;
              }
            }
            iVar3 = -iVar3;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int SymbolicallyPerturbedSign(
    const Vector3_xf& a, const Vector3_xf& b,
    const Vector3_xf& c, const Vector3_xf& b_cross_c) {
  // This method requires that the points are sorted in lexicographically
  // increasing order.  This is because every possible S2Point has its own
  // symbolic perturbation such that if A < B then the symbolic perturbation
  // for A is much larger than the perturbation for B.
  //
  // Alternatively, we could sort the points in this method and keep track of
  // the sign of the permutation, but it is more efficient to do this before
  // converting the inputs to the multi-precision representation, and this
  // also lets us re-use the result of the cross product B x C.
  S2_DCHECK(a < b && b < c);

  // Every input coordinate x[i] is assigned a symbolic perturbation dx[i].
  // We then compute the sign of the determinant of the perturbed points,
  // i.e.
  //               | a[0]+da[0]  a[1]+da[1]  a[2]+da[2] |
  //               | b[0]+db[0]  b[1]+db[1]  b[2]+db[2] |
  //               | c[0]+dc[0]  c[1]+dc[1]  c[2]+dc[2] |
  //
  // The perturbations are chosen such that
  //
  //   da[2] > da[1] > da[0] > db[2] > db[1] > db[0] > dc[2] > dc[1] > dc[0]
  //
  // where each perturbation is so much smaller than the previous one that we
  // don't even need to consider it unless the coefficients of all previous
  // perturbations are zero.  In fact, it is so small that we don't need to
  // consider it unless the coefficient of all products of the previous
  // perturbations are zero.  For example, we don't need to consider the
  // coefficient of db[1] unless the coefficient of db[2]*da[0] is zero.
  //
  // The follow code simply enumerates the coefficients of the perturbations
  // (and products of perturbations) that appear in the determinant above, in
  // order of decreasing perturbation magnitude.  The first non-zero
  // coefficient determines the sign of the result.  The easiest way to
  // enumerate the coefficients in the correct order is to pretend that each
  // perturbation is some tiny value "eps" raised to a power of two:
  //
  // eps**    1      2      4      8     16     32     64     128    256
  //        da[2]  da[1]  da[0]  db[2]  db[1]  db[0]  dc[2]  dc[1]  dc[0]
  //
  // Essentially we can then just count in binary and test the corresponding
  // subset of perturbations at each step.  So for example, we must test the
  // coefficient of db[2]*da[0] before db[1] because eps**12 > eps**16.
  //
  // Of course, not all products of these perturbations appear in the
  // determinant above, since the determinant only contains the products of
  // elements in distinct rows and columns.  Thus we don't need to consider
  // da[2]*da[1], db[1]*da[1], etc.  Furthermore, sometimes different pairs of
  // perturbations have the same coefficient in the determinant; for example,
  // da[1]*db[0] and db[1]*da[0] have the same coefficient (c[2]).  Therefore
  // we only need to test this coefficient the first time we encounter it in
  // the binary order above (which will be db[1]*da[0]).
  //
  // The sequence of tests below also appears in Table 4-ii of the paper
  // referenced above, if you just want to look it up, with the following
  // translations: [a,b,c] -> [i,j,k] and [0,1,2] -> [1,2,3].  Also note that
  // some of the signs are different because the opposite cross product is
  // used (e.g., B x C rather than C x B).

  int det_sign = b_cross_c[2].sgn();            // da[2]
  if (det_sign != 0) return det_sign;
  det_sign = b_cross_c[1].sgn();                // da[1]
  if (det_sign != 0) return det_sign;
  det_sign = b_cross_c[0].sgn();                // da[0]
  if (det_sign != 0) return det_sign;

  det_sign = (c[0]*a[1] - c[1]*a[0]).sgn();     // db[2]
  if (det_sign != 0) return det_sign;
  det_sign = c[0].sgn();                        // db[2] * da[1]
  if (det_sign != 0) return det_sign;
  det_sign = -(c[1].sgn());                     // db[2] * da[0]
  if (det_sign != 0) return det_sign;
  det_sign = (c[2]*a[0] - c[0]*a[2]).sgn();     // db[1]
  if (det_sign != 0) return det_sign;
  det_sign = c[2].sgn();                        // db[1] * da[0]
  if (det_sign != 0) return det_sign;
  // The following test is listed in the paper, but it is redundant because
  // the previous tests guarantee that C == (0, 0, 0).
  S2_DCHECK_EQ(0, (c[1]*a[2] - c[2]*a[1]).sgn());  // db[0]

  det_sign = (a[0]*b[1] - a[1]*b[0]).sgn();     // dc[2]
  if (det_sign != 0) return det_sign;
  det_sign = -(b[0].sgn());                     // dc[2] * da[1]
  if (det_sign != 0) return det_sign;
  det_sign = b[1].sgn();                        // dc[2] * da[0]
  if (det_sign != 0) return det_sign;
  det_sign = a[0].sgn();                        // dc[2] * db[1]
  if (det_sign != 0) return det_sign;
  return 1;                                     // dc[2] * db[1] * da[0]
}